

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv.c
# Opt level: O3

void SharpYUVFilterRow_C(int16_t *A,int16_t *B,int len,uint16_t *best_y,uint16_t *out)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  uint16_t uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  
  if (0 < len) {
    uVar8 = 0;
    do {
      sVar1 = A[uVar8];
      sVar2 = A[uVar8 + 1];
      sVar3 = B[uVar8];
      sVar4 = B[uVar8 + 1];
      uVar7 = (uint)best_y[uVar8 * 2] +
              (sVar1 * 9 + (int)sVar4 + ((int)sVar3 + (int)sVar2) * 3 + 8 >> 4);
      uVar6 = 0x3ff;
      if (uVar7 < 0x3ff) {
        uVar6 = uVar7;
      }
      uVar5 = (uint16_t)uVar6;
      if ((int)uVar7 < 0) {
        uVar5 = 0;
      }
      out[uVar8 * 2] = uVar5;
      uVar7 = (uint)best_y[uVar8 * 2 + 1] +
              (((int)sVar4 + (int)sVar1) * 3 + sVar2 * 9 + (int)sVar3 + 8 >> 4);
      uVar6 = 0x3ff;
      if (uVar7 < 0x3ff) {
        uVar6 = uVar7;
      }
      uVar5 = (uint16_t)uVar6;
      if ((int)uVar7 < 0) {
        uVar5 = 0;
      }
      out[uVar8 * 2 + 1] = uVar5;
      uVar8 = uVar8 + 1;
    } while ((uint)len != uVar8);
  }
  return;
}

Assistant:

static void SharpYUVFilterRow_C(const int16_t* A, const int16_t* B, int len,
                                const uint16_t* best_y, uint16_t* out) {
  int i;
  for (i = 0; i < len; ++i, ++A, ++B) {
    const int v0 = (A[0] * 9 + A[1] * 3 + B[0] * 3 + B[1] + 8) >> 4;
    const int v1 = (A[1] * 9 + A[0] * 3 + B[1] * 3 + B[0] + 8) >> 4;
    out[2 * i + 0] = clip_y(best_y[2 * i + 0] + v0);
    out[2 * i + 1] = clip_y(best_y[2 * i + 1] + v1);
  }
}